

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleDumperPretty.cpp
# Opt level: O3

int main(int param_1,char **param_2)

{
  Slice slice;
  ostream *poVar1;
  Value *sub;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string buffer;
  StringSink sink;
  Builder b;
  undefined8 local_180;
  ValueUnion local_178;
  char local_170;
  undefined7 uStack_16f;
  Value local_160;
  Value local_150;
  Builder local_140;
  Options local_88;
  Value local_58;
  Value local_48;
  Value local_38;
  Value local_28;
  int __fd;
  
  arangodb::velocypack::Builder::Builder(&local_140);
  arangodb::velocypack::Value::Value((Value *)&local_88,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_140,(Value *)&local_88);
  local_180._0_1_ = Int;
  local_180._4_4_ = Int64;
  local_178.d = 5.92878775009496e-323;
  attrName._M_str = "b";
  attrName._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_140,attrName,(Value *)&local_180);
  local_150._valueType = Bool;
  local_150._cType = Bool;
  local_150._value.b = true;
  attrName_00._M_str = "a";
  attrName_00._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_140,attrName_00,&local_150);
  arangodb::velocypack::Value::Value(&local_160,Array,false);
  attrName_01._M_str = "l";
  attrName_01._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_140,attrName_01,&local_160);
  local_28._valueType = Int;
  local_28._cType = Int64;
  local_28._value.d = 4.94065645841247e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_140,&local_28);
  local_38._valueType = Int;
  local_38._cType = Int64;
  local_38._value.d = 9.88131291682493e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_140,&local_38);
  sub = &local_48;
  local_48._valueType = Int;
  local_48._cType = Int64;
  local_48._value.d = 1.48219693752374e-323;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&local_140,sub);
  arangodb::velocypack::Builder::close(&local_140,(int)sub);
  local_58._valueType = String;
  local_58._cType = CharPtr;
  local_58._value.d = 5.5452445892284e-318;
  attrName_02._M_str = "name";
  attrName_02._M_len = 4;
  __fd = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&local_140,attrName_02,&local_58);
  arangodb::velocypack::Builder::close(&local_140,__fd);
  slice._start = arangodb::velocypack::Builder::start(&local_140);
  local_88.unsupportedTypeBehavior = FailOnUnsupportedType;
  local_88.paddingBehavior = Flexible;
  local_88.buildUnindexedArrays = false;
  local_88.buildUnindexedObjects = false;
  local_88.singleLinePrettyPrint = false;
  local_88.keepTopLevelOpen = false;
  local_88.attributeTranslator = (AttributeTranslator *)0x0;
  local_88.customTypeHandler._0_5_ = 0;
  local_88.customTypeHandler._5_3_ = 0;
  local_88.clearBuilderBeforeParse = true;
  local_88.validateUtf8Strings = false;
  local_88.checkAttributeUniqueness = false;
  local_88.escapeForwardSlashes = false;
  local_88.escapeControl = true;
  local_88.escapeUnicode = false;
  local_88.dumpAttributesInIndexOrder = true;
  local_88.unsupportedDoublesAsString = false;
  local_88.binaryAsHex = false;
  local_88.datesAsIntegers = false;
  local_88.disallowExternals = false;
  local_88.disallowCustom = false;
  local_88.disallowTags = false;
  local_88.disallowBCD = false;
  local_88.debugTags = false;
  local_88.nestingLimit = 0xffffffff;
  local_88.prettyPrint = true;
  local_178.d = 0.0;
  local_170 = '\0';
  local_150._0_8_ = &PTR__Sink_0011bc10;
  local_180 = &local_170;
  local_150._value.s = (string *)&local_180;
  arangodb::velocypack::Dumper::dump(slice,(Sink *)&local_150,&local_88);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Resulting JSON:",0xf);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
  std::ostream::put(-8);
  poVar1 = (ostream *)std::ostream::flush();
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_180,local_178.i);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_180 != &local_170) {
    operator_delete(local_180,CONCAT71(uStack_16f,local_170) + 1);
  }
  arangodb::velocypack::Builder::~Builder(&local_140);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  Builder b;
  // build an object with attribute names "b", "a", "l", "name"
  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  Options dumperOptions;
  dumperOptions.prettyPrint = true;
  // now dump the Slice into an std::string
  std::string buffer;
  StringSink sink(&buffer);
  Dumper::dump(s, &sink, &dumperOptions);

  // and print it
  std::cout << "Resulting JSON:" << std::endl << buffer << std::endl;

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}